

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O2

bool __thiscall CScript::IsUnspendable(CScript *this)

{
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  uVar1 = (this->super_CScriptBase)._size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  if (uVar2 != 0) {
    if (0x1c < uVar1) {
      this = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    }
    bVar3 = true;
    if ((this->super_CScriptBase)._union.direct[0] == 'j') goto LAB_00299fbd;
  }
  bVar3 = 10000 < uVar2;
LAB_00299fbd:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool IsUnspendable() const
    {
        return (size() > 0 && *begin() == OP_RETURN) || (size() > MAX_SCRIPT_SIZE);
    }